

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvhsah.hpp
# Opt level: O0

bool BVH::opaqueHit(treenode *node,Ray ray,Hit *h)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  Transparency *this;
  vec3f *b;
  long in_RSI;
  long in_RDI;
  vec3f vVar4;
  undefined8 in_stack_00000008;
  float in_stack_00000010;
  Transparency *bsdf;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  vec2f *in_stack_ffffffffffffff88;
  undefined8 local_58;
  float local_50;
  bool local_1;
  
  uVar3 = (**(code **)**(undefined8 **)(in_RDI + 0x10))
                    (*(undefined8 **)(in_RDI + 0x10),&stack0x00000008,in_RSI);
  if ((uVar3 & 1) == 0) {
    local_1 = false;
  }
  else {
    if (**(long **)(in_RDI + 0x18) == 0) {
      this = (Transparency *)0x0;
    }
    else {
      this = (Transparency *)
             __dynamic_cast(**(long **)(in_RDI + 0x18),&BSDF::typeinfo,&Transparency::typeinfo,0);
    }
    if ((this == (Transparency *)0x0) ||
       (bVar1 = Transparency::isTransparent(this,in_stack_ffffffffffffff88), !bVar1)) {
      local_1 = true;
    }
    else {
      do {
        b = (vec3f *)(in_RSI + 4);
        ::operator*(SUB84(b,0),
                    (vec3f *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
        vVar4 = ::operator+((vec3f *)this,b);
        local_58 = vVar4._0_8_;
        local_50 = vVar4.z;
        in_stack_00000008 = local_58;
        in_stack_00000010 = local_50;
        uVar2 = (**(code **)**(undefined8 **)(in_RDI + 0x10))
                          (*(undefined8 **)(in_RDI + 0x10),&stack0x00000008,in_RSI);
        in_stack_ffffffffffffff87 = false;
        if ((uVar2 & 1) != 0) {
          in_stack_ffffffffffffff87 = Transparency::isTransparent(this,(vec2f *)b);
        }
      } while ((bool)in_stack_ffffffffffffff87 != false);
      bVar1 = Transparency::isTransparent(this,(vec2f *)b);
      local_1 = (bool)((bVar1 ^ 0xffU) & 1);
    }
  }
  return local_1;
}

Assistant:

static inline bool opaqueHit(treenode* node, Ray ray, Primitive::Hit* h)
	{
		if (node->shape->intersect(ray, h))
		{
			Transparency* bsdf = dynamic_cast<Transparency*>(node->object->bsdf);
			if (bsdf == NULL || !bsdf->isTransparent(h->uv))
				return true;
			do {
				ray.origin = h->p + 1e-2 * ray.dir;
			}
			while (node->shape->intersect(ray, h) && bsdf->isTransparent(h->uv));
			return !bsdf->isTransparent(h->uv);
		}
		return false;
	}